

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O1

void __thiscall
OpenMD::BondOrderParameter::collectHistogram
          (BondOrderParameter *this,vector<double,_std::allocator<double>_> *q,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *what)

{
  int *piVar1;
  double dVar2;
  mapped_type *pmVar3;
  long lVar4;
  long lVar5;
  key_type local_40;
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  *local_38;
  
  local_38 = &this->Q_histogram_;
  lVar5 = 0;
  lVar4 = 0;
  do {
    dVar2 = (q->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start[lVar4];
    if ((dVar2 < this->MinQ_) || (this->MaxQ_ <= dVar2)) {
      builtin_strncpy(painCave.errMsg,"q_l value outside reasonable range\n",0x24);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      local_40 = (key_type)((ulong)(uint)(int)((dVar2 - this->MinQ_) / this->deltaQ_) + lVar5);
      pmVar3 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](local_38,&local_40);
      *pmVar3 = *pmVar3 + 1;
      piVar1 = (this->Qcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + lVar4;
      *piVar1 = *piVar1 + 1;
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x100000000;
  } while (lVar4 != 0xd);
  lVar5 = 0;
  lVar4 = 0;
  do {
    dVar2 = *(double *)
             (((what->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start)->_M_value + lVar5 * 4);
    if ((dVar2 < this->MinW_) || (this->MaxW_ <= dVar2)) {
      snprintf(painCave.errMsg,2000,"Re[w_hat] value (%lf) outside reasonable range\n");
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      local_40 = (key_type)((ulong)(uint)(int)((dVar2 - this->MinW_) / this->deltaW_) + lVar4);
      pmVar3 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->W_histogram_,&local_40);
      *pmVar3 = *pmVar3 + 1;
      piVar1 = (int *)((long)(this->Wcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar5);
      *piVar1 = *piVar1 + 1;
    }
    lVar4 = lVar4 + 0x100000000;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x34);
  return;
}

Assistant:

void BondOrderParameter::collectHistogram(std::vector<RealType> q,
                                            std::vector<ComplexType> what) {
    for (int l = 0; l <= lMax_; l++) {
      if (q[l] >= MinQ_ && q[l] < MaxQ_) {
        int qbin = int((q[l] - MinQ_) / deltaQ_);
        Q_histogram_[std::make_pair(qbin, l)] += 1;
        Qcount_[l]++;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "q_l value outside reasonable range\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }

    for (int l = 0; l <= lMax_; l++) {
      if (real(what[l]) >= MinW_ && real(what[l]) < MaxW_) {
        int wbin = int((real(what[l]) - MinW_) / deltaW_);
        W_histogram_[std::make_pair(wbin, l)] += 1;
        Wcount_[l]++;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Re[w_hat] value (%lf) outside reasonable range\n",
                 real(what[l]));
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }
  }